

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBoneSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CBoneSceneNode::helper_updateAbsolutePositionOfAllChildren
          (CBoneSceneNode *this,ISceneNode *Node)

{
  bool bVar1;
  const_iterator Node_00;
  CBoneSceneNode *in_RSI;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *in_RDI;
  const_iterator it;
  _Self local_20;
  
  (*(in_RSI->super_IBoneSceneNode).super_ISceneNode._vptr_ISceneNode[0x20])();
  ISceneNode::getChildren_abi_cxx11_((ISceneNode *)in_RSI);
  Node_00 = ::std::__cxx11::
            list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::begin(in_RDI)
  ;
  while( true ) {
    ISceneNode::getChildren_abi_cxx11_((ISceneNode *)in_RSI);
    local_20._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
         end(in_RDI);
    bVar1 = ::std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_20);
    if (!bVar1) break;
    ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator*
              ((_List_const_iterator<irr::scene::ISceneNode_*> *)0x2c08b2);
    helper_updateAbsolutePositionOfAllChildren(in_RSI,(ISceneNode *)Node_00._M_node);
    ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator++
              ((_List_const_iterator<irr::scene::ISceneNode_*> *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void CBoneSceneNode::helper_updateAbsolutePositionOfAllChildren(ISceneNode *Node)
{
	Node->updateAbsolutePosition();

	ISceneNodeList::const_iterator it = Node->getChildren().begin();
	for (; it != Node->getChildren().end(); ++it) {
		helper_updateAbsolutePositionOfAllChildren((*it));
	}
}